

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O0

void defyx::initCache(defyx_cache *cache,void *key,size_t keySize)

{
  uint32_t uVar1;
  Instruction *this;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  long in_RDI;
  uint64_t rcp;
  Instruction *instr;
  uint j;
  int i;
  Blake2Generator gen;
  argon2_context context;
  argon2_instance_t instance;
  uint32_t segment_length;
  uint32_t memory_blocks;
  Blake2Generator *in_stack_00000878;
  SuperscalarProgram *in_stack_00000880;
  undefined4 in_stack_fffffffffffffeb8;
  uint32_t in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  size_t in_stack_fffffffffffffed0;
  void *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  uint uVar2;
  uint pc;
  undefined4 in_stack_fffffffffffffee4;
  int iVar3;
  argon2_context *in_stack_ffffffffffffff10;
  argon2_instance_t *in_stack_ffffffffffffff18;
  
  rxa2_argon_initialize(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  rxa2_fill_memory_blocks
            ((argon2_instance_t *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x12adde);
  Blake2Generator::Blake2Generator
            ((Blake2Generator *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
  for (iVar3 = 0; iVar3 < 2; iVar3 = iVar3 + 1) {
    generateSuperscalar(in_stack_00000880,in_stack_00000878);
    uVar2 = 0;
    while (pc = uVar2,
          uVar1 = SuperscalarProgram::getSize
                            ((SuperscalarProgram *)(in_RDI + 0x28 + (long)iVar3 * 0x1068)),
          uVar2 < uVar1) {
      this = SuperscalarProgram::operator()
                       ((SuperscalarProgram *)(in_RDI + 0x28 + (long)iVar3 * 0x1068),pc);
      if (this->opcode == '\r') {
        uVar1 = Instruction::getImm32((Instruction *)0x12aeb0);
        this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  defyx_reciprocal((ulong)uVar1);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x20f8));
        Instruction::setImm32(this,in_stack_fffffffffffffebc);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (this_00,(value_type *)CONCAT44(uVar2,in_stack_fffffffffffffec8));
      }
      uVar2 = pc + 1;
    }
  }
  return;
}

Assistant:

void initCache(defyx_cache* cache, const void* key, size_t keySize) {
		uint32_t memory_blocks, segment_length;
		argon2_instance_t instance;
		argon2_context context;

		context.out = nullptr;
		context.outlen = 0;
		context.pwd = CONST_CAST(uint8_t *)key;
		context.pwdlen = (uint32_t)keySize;
		context.salt = CONST_CAST(uint8_t *)RANDOMX_ARGON_SALT;
		context.saltlen = (uint32_t)defyx::ArgonSaltSize;
		context.secret = NULL;
		context.secretlen = 0;
		context.ad = NULL;
		context.adlen = 0;
		context.t_cost = RANDOMX_ARGON_ITERATIONS;
		context.m_cost = RANDOMX_ARGON_MEMORY;
		context.lanes = RANDOMX_ARGON_LANES;
		context.threads = 1;
		context.allocate_cbk = NULL;
		context.free_cbk = NULL;
		context.flags = ARGON2_DEFAULT_FLAGS;
		context.version = ARGON2_VERSION_NUMBER;

		/* 2. Align memory size */
		/* Minimum memory_blocks = 8L blocks, where L is the number of lanes */
		memory_blocks = context.m_cost;

		segment_length = memory_blocks / (context.lanes * ARGON2_SYNC_POINTS);

		instance.version = context.version;
		instance.memory = NULL;
		instance.passes = context.t_cost;
		instance.memory_blocks = memory_blocks;
		instance.segment_length = segment_length;
		instance.lane_length = segment_length * ARGON2_SYNC_POINTS;
		instance.lanes = context.lanes;
		instance.threads = context.threads;
		instance.type = Argon2_d;
		instance.memory = (block*)cache->memory;

		if (instance.threads > instance.lanes) {
			instance.threads = instance.lanes;
		}

		/* 3. Initialization: Hashing inputs, allocating memory, filling first
		 * blocks
		 */
		rxa2_argon_initialize(&instance, &context);

		rxa2_fill_memory_blocks(&instance);

		cache->reciprocalCache.clear();
		defyx::Blake2Generator gen(key, keySize);
		for (int i = 0; i < RANDOMX_CACHE_ACCESSES; ++i) {
			defyx::generateSuperscalar(cache->programs[i], gen);
			for (unsigned j = 0; j < cache->programs[i].getSize(); ++j) {
				auto& instr = cache->programs[i](j);
				if ((SuperscalarInstructionType)instr.opcode == SuperscalarInstructionType::IMUL_RCP) {
					auto rcp = defyx_reciprocal(instr.getImm32());
					instr.setImm32(cache->reciprocalCache.size());
					cache->reciprocalCache.push_back(rcp);
				}
			}
		}
	}